

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool (anonymous_namespace)::qt_starts_with_impl<QStringView,QStringView>
               (QStringView haystack,QStringView needle,CaseSensitivity cs)

{
  long lVar1;
  QStringView rhs;
  QStringView lhs;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  storage_type_conflict *in_RCX;
  storage_type_conflict *in_RDX;
  storage_type_conflict *in_RDI;
  long in_FS_OFFSET;
  qsizetype needleLen;
  qsizetype haystackLen;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QStringView::isNull((QStringView *)&stack0xffffffffffffffe8);
  if (bVar2) {
    local_39 = QStringView::isNull((QStringView *)&stack0xffffffffffffffd8);
  }
  else {
    qVar4 = QStringView::size((QStringView *)&stack0xffffffffffffffe8);
    qVar5 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
    if (qVar4 == 0) {
      local_39 = qVar5 == 0;
    }
    else if (qVar4 < qVar5) {
      local_39 = false;
    }
    else {
      QStringView::first((QStringView *)
                         CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),0x14e959);
      lhs.m_size = (qsizetype)in_RDI;
      lhs.m_data = in_RCX;
      rhs.m_size = (qsizetype)in_RDX;
      rhs.m_data = in_RCX;
      iVar3 = QtPrivate::compareStrings(lhs,rhs,(CaseSensitivity)in_RDX);
      local_39 = iVar3 == 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_starts_with_impl(Haystack haystack, Needle needle, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.isNull())
        return needle.isNull();
    const auto haystackLen = haystack.size();
    const auto needleLen = needle.size();
    if (haystackLen == 0)
        return needleLen == 0;
    if (needleLen > haystackLen)
        return false;

    return QtPrivate::compareStrings(haystack.first(needleLen), needle, cs) == 0;
}